

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O2

uint64_t xorshift_rand(void)

{
  ulong uVar1;
  long in_FS_OFFSET;
  
  uVar1 = *(ulong *)(in_FS_OFFSET + -0x28);
  if (uVar1 == 0) {
    rand();
  }
  uVar1 = uVar1 >> 0xc ^ uVar1;
  uVar1 = uVar1 << 0x19 ^ uVar1;
  uVar1 = uVar1 >> 0x1b ^ uVar1;
  *(ulong *)(in_FS_OFFSET + -0x28) = uVar1;
  return uVar1 * 0x2545f4914f6cdd1d;
}

Assistant:

uint64_t
xorshift_rand(void)
{
    uint64_t x = seed;
    if (seed == 0) seed = rand();
    x ^= x >> 12;
    x ^= x << 25;
    x ^= x >> 27;
    seed = x;
    return x * 2685821657736338717LL;
}